

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O1

int __thiscall
ncnn::Layer::forward
          (Layer *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  pointer pMVar3;
  int *piVar4;
  long *plVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  Option *pOVar9;
  long lVar10;
  void *in_R8;
  long lVar11;
  Mat local_78;
  Layer *local_38;
  
  iVar7 = -1;
  if (this->support_inplace == true) {
    pOVar9 = opt;
    local_38 = this;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(top_blobs,bottom_blobs);
    iVar7 = (int)((ulong)((long)(top_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
    bVar6 = 0 < iVar7;
    if (0 < iVar7) {
      lVar10 = 0;
      lVar11 = 0;
      do {
        Mat::clone(&local_78,
                   (__fn *)((long)&((bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->data + lVar10),
                   opt->blob_allocator,(int)pOVar9,in_R8);
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar1 = (Mat *)((long)&pMVar3->data + lVar10);
        if (pMVar1 != &local_78) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar4 = *(int **)((long)&pMVar3->refcount + lVar10);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              lVar8 = *(long *)((long)&pMVar3->data + lVar10);
              plVar5 = *(long **)((long)&pMVar3->allocator + lVar10);
              if (plVar5 == (long *)0x0) {
                if (lVar8 != 0) {
                  free(*(void **)(lVar8 + -8));
                }
              }
              else {
                (**(code **)(*plVar5 + 8))();
              }
            }
          }
          pMVar1->data = (void *)0x0;
          pMVar1->refcount = (int *)0x0;
          pMVar1->elemsize = 0;
          *(undefined8 *)((long)&pMVar3->cstep + lVar10) = 0;
          puVar2 = (undefined8 *)((long)&pMVar3->dims + lVar10);
          *puVar2 = 0;
          puVar2[1] = 0;
          plVar5 = (long *)((long)&pMVar3->data + lVar10);
          *plVar5 = (long)local_78.data;
          plVar5[1] = (long)local_78.refcount;
          *(size_t *)((long)&pMVar3->elemsize + lVar10) = local_78.elemsize;
          *(Allocator **)((long)&pMVar3->allocator + lVar10) = local_78.allocator;
          piVar4 = (int *)((long)&pMVar3->dims + lVar10);
          *piVar4 = local_78.dims;
          piVar4[1] = local_78.w;
          piVar4[2] = local_78.h;
          piVar4[3] = local_78.c;
          *(size_t *)((long)&pMVar3->cstep + lVar10) = local_78.cstep;
        }
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(*(void **)((long)local_78.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_78.allocator + 8))();
            }
          }
        }
        local_78.data = (void *)0x0;
        local_78.refcount = (int *)0x0;
        local_78.elemsize = 0;
        local_78.cstep = 0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((*(long *)((long)&pMVar3->data + lVar10) == 0) ||
           (pOVar9 = (Option *)
                     ((long)*(int *)((long)&pMVar3->c + lVar10) *
                     *(long *)((long)&pMVar3->cstep + lVar10)), pOVar9 == (Option *)0x0)) {
          if (bVar6) {
            return -100;
          }
          break;
        }
        lVar11 = lVar11 + 1;
        lVar8 = (long)((int)((ulong)((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(top_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x49249249);
        lVar10 = lVar10 + 0x38;
        bVar6 = lVar11 < lVar8;
      } while (lVar11 < lVar8);
    }
    iVar7 = (*local_38->_vptr_Layer[6])(local_38,top_blobs,opt);
  }
  return iVar7;
}

Assistant:

int Layer::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blobs = bottom_blobs;
    for (int i = 0; i < (int)top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blobs[i].clone(opt.blob_allocator);
        if (top_blobs[i].empty())
            return -100;
    }

    return forward_inplace(top_blobs, opt);
}